

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
          (BasicExprFactory<std::allocator<char>> *this,LogicalExpr condition,
          BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> then_expr,
          BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> else_expr)

{
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> BVar1;
  
  BVar1.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>)
       Allocate<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
                 (this,IMPLICATION,0);
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ + 8))->
  impl_ = (Impl *)condition.super_ExprBase.impl_;
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ + 0x10))
  ->impl_ = (Impl *)then_expr.super_ExprBase.impl_;
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ + 0x18))
  ->impl_ = (Impl *)else_expr.super_ExprBase.impl_;
  return (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)
         BVar1.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeIf(LogicalExpr condition, Arg then_expr, Arg else_expr) {
    /// else_expr can be null.
    MP_ASSERT(condition != 0 && then_expr != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(ExprType::KIND);
    impl->condition = condition.impl_;
    impl->then_expr = then_expr.impl_;
    impl->else_expr = else_expr.impl_;
    return Expr::Create<ExprType>(impl);
  }